

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vm.cpp
# Opt level: O2

void __thiscall vm::VM::Tmul<int>(VM *this)

{
  int_t iVar1;
  int_t iVar2;
  
  iVar1 = POP<int>(this);
  iVar2 = POP<int>(this);
  PUSH<int>(this,iVar1 * iVar2);
  return;
}

Assistant:

void VM::Tmul() {
    static_assert(std::is_arithmetic_v<T>);
    auto rhs = POP<T>();
    auto lhs = POP<T>();
    PUSH(lhs*rhs);
}